

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall
server_context::send_rerank(server_context *this,server_slot *slot,llama_batch *batch)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  pointer psVar5;
  common_log *pcVar6;
  server_response *this_00;
  int *__n;
  int *in_RDX;
  void *__buf;
  uint *in_RSI;
  long in_RDI;
  int __flags;
  char *in_R8;
  float *embd;
  int i;
  __single_object res;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 local_48 [24];
  float *local_30;
  int local_24;
  int *local_18;
  uint *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  httplib::detail::std::make_unique<server_task_result_rerank>();
  uVar2 = local_10[1];
  psVar5 = httplib::detail::std::
           unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>::
           operator->((unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>
                       *)0x2a4b15);
  (psVar5->super_server_task_result).id = uVar2;
  uVar4 = *(undefined8 *)(local_10 + 0x1e);
  psVar5 = httplib::detail::std::
           unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>::
           operator->((unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>
                       *)0x2a4b39);
  psVar5->index = (int)uVar4;
  uVar2 = local_10[0x1da];
  psVar5 = httplib::detail::std::
           unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>::
           operator->((unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>
                       *)0x2a4b5f);
  psVar5->n_tokens = uVar2;
  for (local_24 = 0; __flags = (int)in_R8, local_24 < *local_18; local_24 = local_24 + 1) {
    if ((*(char *)(*(long *)(local_18 + 0xc) + (long)local_24) != '\0') &&
       (**(uint **)(*(long *)(local_18 + 10) + (long)local_24 * 8) == *local_10)) {
      local_30 = (float *)llama_get_embeddings_seq
                                    (*(undefined8 *)(in_RDI + 0x13a0),
                                     **(undefined4 **)
                                       (*(long *)(local_18 + 10) + (long)local_24 * 8));
      if (local_30 == (float *)0x0) {
        local_30 = (float *)llama_get_embeddings_ith(*(undefined8 *)(in_RDI + 0x13a0),local_24);
      }
      if (local_30 == (float *)0x0) {
        if (-1 < common_log_verbosity_thold) {
          pcVar6 = common_log_main();
          in_stack_ffffffffffffff50 = *(undefined4 *)(*(long *)(local_18 + 2) + (long)local_24 * 4);
          in_stack_ffffffffffffff58 =
               **(undefined4 **)(*(long *)(local_18 + 10) + (long)local_24 * 8);
          in_R8 = "send_rerank";
          common_log_add(pcVar6,GGML_LOG_LEVEL_ERROR,
                         "slot %12.*s: id %2d | task %d | failed to get embeddings, token = %d, seq_id = %d\n"
                         ,0xc,"send_rerank",(ulong)*local_10,local_10[1]);
        }
        psVar5 = httplib::detail::std::
                 unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>
                 ::operator->((unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>
                               *)0x2a4cf8);
        psVar5->score = -1e+06;
      }
      else {
        fVar1 = *local_30;
        psVar5 = httplib::detail::std::
                 unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>
                 ::operator->((unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>
                               *)0x2a4d26);
        psVar5->score = fVar1;
      }
    }
  }
  __n = &common_log_verbosity_thold;
  if (0 < common_log_verbosity_thold) {
    pcVar6 = common_log_main();
    uVar2 = *local_10;
    uVar3 = local_10[1];
    psVar5 = httplib::detail::std::
             unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>
             ::operator->((unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>
                           *)0x2a4d87);
    __flags = 0x446b09;
    __n = (int *)0xc;
    common_log_add((common_log *)(double)psVar5->score,(ggml_log_level)pcVar6,(char *)0x1,
                   "slot %12.*s: id %2d | task %d | sending rerank result, res.score = %f\n",0xc,
                   "send_rerank",(ulong)uVar2,uVar3);
  }
  this_00 = (server_response *)(in_RDI + 0x15d8);
  std::unique_ptr<server_task_result,std::default_delete<server_task_result>>::
  unique_ptr<server_task_result_rerank,std::default_delete<server_task_result_rerank>,void>
            ((unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)this_00,
             (unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>
              *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  server_response::send(this_00,(int)local_48,__buf,(size_t)__n,__flags);
  httplib::detail::std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>::
  ~unique_ptr((unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)this_00);
  httplib::detail::std::
  unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>::
  ~unique_ptr((unique_ptr<server_task_result_rerank,_std::default_delete<server_task_result_rerank>_>
               *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  return;
}

Assistant:

void send_rerank(const server_slot & slot, const llama_batch & batch) {
        auto res = std::make_unique<server_task_result_rerank>();
        res->id    = slot.id_task;
        res->index = slot.index;
        res->n_tokens = slot.n_prompt_tokens;

        for (int i = 0; i < batch.n_tokens; ++i) {
            if (!batch.logits[i] || batch.seq_id[i][0] != slot.id) {
                continue;
            }

            const float * embd = llama_get_embeddings_seq(ctx, batch.seq_id[i][0]);
            if (embd == NULL) {
                embd = llama_get_embeddings_ith(ctx, i);
            }

            if (embd == NULL) {
                SLT_ERR(slot, "failed to get embeddings, token = %d, seq_id = %d\n", batch.token[i], batch.seq_id[i][0]);

                res->score = -1e6;
                continue;
            }

            res->score = embd[0];
        }

        SLT_DBG(slot, "sending rerank result, res.score = %f\n", res->score);

        queue_results.send(std::move(res));
    }